

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::analysis::ConstantManager::CreateCompositeInstruction
          (ConstantManager *this,uint32_t result_id,CompositeConstant *cc,uint32_t type_id)

{
  IRContext *pIVar1;
  undefined8 *puVar2;
  Constant *c;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var3;
  uint32_t uVar4;
  Instruction *pIVar5;
  long *plVar6;
  undefined4 in_register_0000000c;
  undefined8 *puVar7;
  uint uVar8;
  undefined4 in_register_00000034;
  ConstantManager *this_00;
  uint32_t in_R8D;
  int iVar9;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  uint32_t local_70;
  spv_operand_type_t local_6c;
  long *local_68;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_60;
  OperandList local_58;
  initializer_list<unsigned_int> local_40;
  
  this_00 = (ConstantManager *)CONCAT44(in_register_00000034,result_id);
  plVar6 = (long *)CONCAT44(in_register_0000000c,type_id);
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar1 = this_00->ctx_;
  local_60._M_head_impl = (Instruction *)this;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar5 = DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,in_R8D);
  local_68 = plVar6;
  plVar6 = (long *)(**(code **)(*plVar6 + 0xc0))(plVar6);
  puVar7 = (undefined8 *)*plVar6;
  puVar2 = (undefined8 *)plVar6[1];
  if (puVar7 != puVar2) {
    iVar9 = 0;
    do {
      c = (Constant *)*puVar7;
      uVar4 = 0;
      if (pIVar5 != (Instruction *)0x0) {
        if (pIVar5->opcode_ == OpTypeArray) {
          uVar4 = (pIVar5->has_result_id_ & 1) + 1;
          if (pIVar5->has_type_id_ == false) {
            uVar4 = (uint)pIVar5->has_result_id_;
          }
        }
        else {
          if (pIVar5->opcode_ != OpTypeStruct) goto LAB_00542d35;
          uVar8 = (pIVar5->has_result_id_ & 1) + 1;
          if (pIVar5->has_type_id_ == false) {
            uVar8 = (uint)pIVar5->has_result_id_;
          }
          uVar4 = uVar8 + iVar9;
        }
        uVar4 = Instruction::GetSingleWordOperand(pIVar5,uVar4);
      }
LAB_00542d35:
      uVar4 = FindDeclaredConstant(this_00,c,uVar4);
      if (uVar4 == 0) {
        pIVar5 = (Instruction *)0x0;
        goto LAB_00542dee;
      }
      local_6c = SPV_OPERAND_TYPE_ID;
      local_40._M_array = &local_70;
      local_40._M_len = 1;
      local_70 = uVar4;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_58,
                 &local_6c,&local_40);
      iVar9 = iVar9 + 1;
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  if (in_R8D == 0) {
    pIVar1 = this_00->ctx_;
    if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar1);
    }
    in_R8D = TypeManager::GetId((pIVar1->type_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>
                                ._M_head_impl,(Type *)local_68[1]);
  }
  pIVar1 = this_00->ctx_;
  pIVar5 = (Instruction *)operator_new(0x70);
  Instruction::Instruction(pIVar5,pIVar1,OpConstantComposite,in_R8D,(uint32_t)cc,&local_58);
LAB_00542dee:
  _Var3._M_head_impl = local_60._M_head_impl;
  ((local_60._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  _vptr_IntrusiveNodeBase = (_func_int **)pIVar5;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_58);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )_Var3._M_head_impl;
}

Assistant:

std::unique_ptr<Instruction> ConstantManager::CreateCompositeInstruction(
    uint32_t result_id, const CompositeConstant* cc, uint32_t type_id) const {
  std::vector<Operand> operands;
  Instruction* type_inst = context()->get_def_use_mgr()->GetDef(type_id);
  uint32_t component_index = 0;
  for (const Constant* component_const : cc->GetComponents()) {
    uint32_t component_type_id = 0;
    if (type_inst && type_inst->opcode() == spv::Op::OpTypeStruct) {
      component_type_id = type_inst->GetSingleWordInOperand(component_index);
    } else if (type_inst && type_inst->opcode() == spv::Op::OpTypeArray) {
      component_type_id = type_inst->GetSingleWordInOperand(0);
    }
    uint32_t id = FindDeclaredConstant(component_const, component_type_id);

    if (id == 0) {
      // Cannot get the id of the component constant, while all components
      // should have been added to the module prior to the composite constant.
      // Cannot create OpConstantComposite instruction in this case.
      return nullptr;
    }
    operands.emplace_back(spv_operand_type_t::SPV_OPERAND_TYPE_ID,
                          std::initializer_list<uint32_t>{id});
    component_index++;
  }
  uint32_t type =
      (type_id == 0) ? context()->get_type_mgr()->GetId(cc->type()) : type_id;
  return MakeUnique<Instruction>(context(), spv::Op::OpConstantComposite, type,
                                 result_id, std::move(operands));
}